

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkdiskcache.cpp
# Opt level: O2

QString * QNetworkDiskCachePrivate::uniqueFileName(QString *__return_storage_ptr__,QUrl *url)

{
  byte bVar1;
  char *pcVar2;
  qsizetype qVar3;
  undefined8 *puVar4;
  long in_FS_OFFSET;
  QByteArrayView QVar5;
  QArrayDataPointer<char16_t> local_128;
  QArrayDataPointer<char> local_108;
  QArrayDataPointer<char> local_e8;
  QUrl cleanUrl;
  QStringBuilder<QString,_char16_t> local_c8;
  QStringBuilder<QStringBuilder<QString,_char16_t>,_QLatin1String> local_a8;
  QStringBuilder<QStringBuilder<QStringBuilder<QString,_char16_t>,_QLatin1String>,_QLatin1String>
  local_78;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  cleanUrl.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QUrl::QUrl(&cleanUrl,url);
  local_78.a.a.a.d.d = (Data *)0x0;
  local_78.a.a.a.d.ptr = (char16_t *)0x0;
  local_78.a.a.a.d.size = 0;
  QUrl::setPassword((QString *)&cleanUrl,(ParsingMode)&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
  local_78.a.a.a.d.d = (Data *)0x0;
  local_78.a.a.a.d.ptr = (char16_t *)0x0;
  local_78.a.a.a.d.size = 0;
  QUrl::setFragment((QString *)&cleanUrl,(ParsingMode)&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
  local_e8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_e8.d._0_4_ = 0xaaaaaaaa;
  local_e8.d._4_4_ = 0xaaaaaaaa;
  local_e8.ptr._0_4_ = 0xaaaaaaaa;
  local_e8.ptr._4_4_ = 0xaaaaaaaa;
  QUrl::toEncoded(&local_78,&cleanUrl,0x1f00000);
  QVar5.m_data = (storage_type *)local_78.a.a.a.d.size;
  QVar5.m_size = (qsizetype)&local_e8;
  QCryptographicHash::hash(QVar5,(Algorithm)local_78.a.a.a.d.ptr);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_78);
  local_108.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_108.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_108.ptr = &DAT_aaaaaaaaaaaaaaaa;
  puVar4 = (undefined8 *)CONCAT44(local_e8.ptr._4_4_,local_e8.ptr._0_4_);
  if (puVar4 == (undefined8 *)0x0) {
    puVar4 = &QByteArray::_empty;
  }
  QByteArray::number((longlong)&local_78,(int)*puVar4);
  QByteArray::left((QByteArray *)&local_108,(QByteArray *)&local_78,8);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_78);
  bVar1 = local_108.ptr[(long)(local_108.size + -1)];
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::number((uint)&local_128,bVar1 & 0xf);
  qVar3 = local_108.size;
  pcVar2 = local_108.ptr;
  local_c8.a.d.size = local_128.size;
  local_c8.a.d.ptr = local_128.ptr;
  local_c8.a.d.d = local_128.d;
  local_128.d = (Data *)0x0;
  local_128.ptr = (char16_t *)0x0;
  local_128.size = 0;
  local_c8.b = L'/';
  QStringBuilder<QString,_char16_t>::QStringBuilder(&local_a8.a,&local_c8);
  local_a8.b.m_size = qVar3;
  local_a8.b.m_data = pcVar2;
  QStringBuilder<QStringBuilder<QString,_char16_t>,_QLatin1String>::QStringBuilder
            (&local_78.a,&local_a8);
  local_78.b.m_size = 2;
  local_78.b.m_data = ".d";
  QStringBuilder<QStringBuilder<QStringBuilder<QString,_char16_t>,_QLatin1String>,_QLatin1String>::
  convertTo<QString>(__return_storage_ptr__,&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_c8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_128);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_108);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_e8);
  QUrl::~QUrl(&cleanUrl);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QNetworkDiskCachePrivate::uniqueFileName(const QUrl &url)
{
    QUrl cleanUrl = url;
    cleanUrl.setPassword(QString());
    cleanUrl.setFragment(QString());

    const QByteArray hash = QCryptographicHash::hash(cleanUrl.toEncoded(), QCryptographicHash::Sha1);
    // convert sha1 to base36 form and return first 8 bytes for use as string
    const QByteArray id = QByteArray::number(*(qlonglong*)hash.data(), 36).left(8);
    // generates <one-char subdir>/<8-char filename.d>
    uint code = (uint)id.at(id.size()-1) % 16;
    QString pathFragment = QString::number(code, 16) + u'/' + QLatin1StringView(id) + CACHE_POSTFIX;

    return pathFragment;
}